

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O1

pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> * __thiscall
libtorrent::bdecode_node::dict_at
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
           *__return_storage_ptr__,bdecode_node *this,int i)

{
  uint uVar1;
  uint uVar2;
  pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> local_88;
  
  dict_at_node(&local_88,this,i);
  uVar1 = SUB84(local_88.first.m_root_tokens[local_88.first.m_token_idx],0);
  uVar2 = (SUB84(local_88.first.m_root_tokens[local_88.first.m_token_idx],4) >> 0x1d) +
          (uint)((uVar1 & 0xe0000000) != 0x60000000) * 8;
  (__return_storage_ptr__->first)._M_len =
       (long)(int)(((*(uint *)(local_88.first.m_root_tokens + (long)local_88.first.m_token_idx + 1)
                    & 0x1fffffff) - ((uVar1 & 0x1fffffff) + uVar2)) + -2);
  (__return_storage_ptr__->first)._M_str =
       local_88.first.m_buffer + (ulong)uVar2 + (ulong)(uVar1 & 0x1fffffff) + 2;
  bdecode_node(&__return_storage_ptr__->second,&local_88.second);
  if (local_88.second.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.second.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.second.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.second.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.first.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.first.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.first.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.first.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, bdecode_node> bdecode_node::dict_at(int const i) const
	{
		auto const [key, value] = dict_at_node(i);
		return {key.string_value(), value};
	}